

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void VLin1_Serial(sunrealtype a,N_Vector x,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector y_local;
  N_Vector x_local;
  sunrealtype a_local;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar3 = *(long *)((long)y->content + 0x10);
  lVar4 = *(long *)((long)z->content + 0x10);
  for (i = 0; i < lVar1; i = i + 1) {
    *(double *)(lVar4 + i * 8) = a * *(double *)(lVar2 + i * 8) + *(double *)(lVar3 + i * 8);
  }
  return;
}

Assistant:

static void VLin1_Serial(sunrealtype a, N_Vector x, N_Vector y, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *yd, *zd;

  xd = yd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = (a * xd[i]) + yd[i]; }

  return;
}